

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool,false,false>
               (interval_t *ldata,dtime_tz_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  dtime_tz_t left;
  dtime_tz_t left_00;
  dtime_tz_t *pdVar2;
  dtime_tz_t *pdVar3;
  dtime_tz_t dVar4;
  int64_t *piVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  undefined4 local_7c;
  int64_t *local_78;
  dtime_tz_t *local_70;
  undefined4 local_68;
  undefined4 local_64;
  dtime_tz_t *local_60;
  ulong local_58;
  ulong local_50;
  ValidityMask *local_48;
  ulong local_40;
  dtime_tz_t *local_38;
  
  local_70 = rdata;
  local_48 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &ldata->micros;
      iVar7 = 0;
      do {
        piVar5 = local_78;
        dVar4.bits._0_4_ = ((interval_t *)(local_78 + -1))->months;
        dVar4.bits._4_4_ = ((interval_t *)(local_78 + -1))->days;
        local_64 = 0;
        right_01.micros = (int64_t)&local_64;
        right_01._0_8_ = *local_78;
        dVar4 = Interval::Add((Interval *)local_70[iVar7].bits,dVar4,right_01,(date_t *)mask);
        result_data[iVar7].bits = dVar4.bits;
        iVar7 = iVar7 + 1;
        local_78 = piVar5 + 2;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_58 = count + 0x3f >> 6;
    local_78 = &ldata->micros;
    local_40 = 0;
    uVar10 = 0;
    local_60 = result_data;
    local_50 = count;
    do {
      pdVar3 = local_60;
      pdVar2 = local_70;
      puVar1 = (local_48->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        uVar8 = puVar1[local_40];
      }
      uVar9 = uVar10 + 0x40;
      if (local_50 <= uVar10 + 0x40) {
        uVar9 = local_50;
      }
      uVar6 = uVar9;
      if (uVar8 != 0) {
        uVar6 = uVar10;
        if (uVar8 == 0xffffffffffffffff) {
          if (uVar10 < uVar9) {
            piVar5 = local_78 + uVar10 * 2;
            do {
              left.bits._0_4_ = ((interval_t *)(piVar5 + -1))->months;
              left.bits._4_4_ = ((interval_t *)(piVar5 + -1))->days;
              local_7c = 0;
              right.micros = (int64_t)&local_7c;
              right._0_8_ = *piVar5;
              dVar4 = Interval::Add((Interval *)pdVar2[uVar10].bits,left,right,(date_t *)mask);
              pdVar3[uVar10].bits = dVar4.bits;
              uVar10 = uVar10 + 1;
              piVar5 = piVar5 + 2;
              uVar6 = uVar10;
            } while (uVar9 != uVar10);
          }
        }
        else if (uVar10 < uVar9) {
          local_38 = local_60 + uVar10;
          piVar5 = local_78 + uVar10 * 2;
          uVar6 = 0;
          do {
            if ((uVar8 >> (uVar6 & 0x3f) & 1) != 0) {
              left_00.bits._0_4_ = ((interval_t *)(piVar5 + -1))->months;
              left_00.bits._4_4_ = ((interval_t *)(piVar5 + -1))->days;
              local_68 = 0;
              right_00.micros = (int64_t)&local_68;
              right_00._0_8_ = *piVar5;
              dVar4 = Interval::Add((Interval *)pdVar2[uVar10 + uVar6].bits,left_00,right_00,
                                    (date_t *)mask);
              local_38[uVar6].bits = dVar4.bits;
            }
            uVar6 = uVar6 + 1;
            piVar5 = piVar5 + 2;
          } while ((uVar10 - uVar9) + uVar6 != 0);
          uVar6 = uVar10 + uVar6;
        }
      }
      local_40 = local_40 + 1;
      uVar10 = uVar6;
    } while (local_40 != local_58);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}